

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O1

void __thiscall VFS::CVFS::CVFSDir::RenameChild(CVFSDir *this,string *Name,string *NewName)

{
  mutex *__mutex;
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *this_00;
  pointer psVar1;
  element_type *peVar2;
  pointer pcVar3;
  int iVar4;
  size_t sVar5;
  undefined8 uVar6;
  bool bVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  pthread_mutex_t *local_70;
  VFSNode local_68;
  string *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  __mutex = &(this->super_CVFSNode).m_UpdateLock;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    local_58 = NewName;
    sVar5 = Search(this,Name,0,
                   ((long)(this->m_Childs).
                          super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_Childs).
                          super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
    this_00 = &this->m_Childs;
    psVar1 = (this_00->
             super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar1[sVar5].super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78 = psVar1[sVar5].super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_78->_M_use_count = local_78->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_78->_M_use_count = local_78->_M_use_count + 1;
      }
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&peVar2->m_UpdateLock);
    local_70 = (pthread_mutex_t *)__mutex;
    if (iVar4 == 0) {
      local_50 = local_40;
      pcVar3 = (peVar2->m_Name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + (peVar2->m_Name)._M_string_length);
      pthread_mutex_unlock((pthread_mutex_t *)&peVar2->m_UpdateLock);
      if (local_48 == Name->_M_string_length) {
        if (local_48 == 0) {
          bVar7 = true;
        }
        else {
          iVar4 = bcmp(local_50,(Name->_M_dataplus)._M_p,local_48);
          bVar7 = iVar4 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar7) {
        std::
        vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
        _M_erase(this_00,(this_00->
                         super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + sVar5);
        std::__cxx11::string::_M_assign((string *)&peVar2->m_Name);
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_78->_M_use_count = local_78->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_78->_M_use_count = local_78->_M_use_count + 1;
          }
        }
        local_68.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
        local_68.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_78;
        InternalAppendChild(this,&local_68);
        if (local_68.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
  }
  else {
    iVar4 = std::__throw_system_error(iVar4);
  }
  uVar6 = std::__throw_system_error(iVar4);
  if (local_68.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  pthread_mutex_unlock(local_70);
  _Unwind_Resume(uVar6);
}

Assistant:

void RenameChild(const std::string &Name, const std::string &NewName)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        size_t Pos = Search(Name, 0, m_Childs.size() - 1);
                        auto Child = m_Childs[Pos];
                        if(Child->Name() == Name)
                        {
                            m_Childs.erase(m_Childs.begin() + Pos); //Removes the child temporary.
                            Child->m_Name = NewName;

                            InternalAppendChild(Child);
                        }
                    }